

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.h
# Opt level: O0

void __thiscall
GdlBinaryExpression::GdlBinaryExpression
          (GdlBinaryExpression *this,Symbol psymOperator,GdlExpression *pexpOp1,
          GdlExpression *pexpOp2)

{
  bool bVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined6 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc6;
  undefined1 in_stack_ffffffffffffffc7;
  
  GdlExpression::GdlExpression
            ((GdlExpression *)
             CONCAT17(in_stack_ffffffffffffffc7,
                      CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0)));
  *in_RDI = &PTR_Clone_0036b2e0;
  in_RDI[7] = in_RSI;
  in_RDI[8] = in_RDX;
  in_RDI[9] = in_RCX;
  if ((in_RDI[8] != 0) && (bVar1 = GdlObject::LineIsZero((GdlObject *)0x16e2fe), bVar1)) {
    (**(code **)(*(long *)in_RDI[8] + 0x20))((long *)in_RDI[8],in_RDI + 1);
  }
  if ((in_RDI[9] != 0) && (bVar1 = GdlObject::LineIsZero((GdlObject *)0x16e360), bVar1)) {
    (**(code **)(*(long *)in_RDI[9] + 0x20))((long *)in_RDI[9],in_RDI + 1);
  }
  return;
}

Assistant:

GdlBinaryExpression(Symbol psymOperator, GdlExpression * pexpOp1, GdlExpression * pexpOp2)
		:	GdlExpression(),
			m_psymOperator(psymOperator),
			m_pexpOperand1(pexpOp1),
			m_pexpOperand2(pexpOp2)
	{
		if (m_pexpOperand1 && m_pexpOperand1->LineIsZero())
			m_pexpOperand1->PropagateLineAndFile(m_lnf);
		if (m_pexpOperand2 && m_pexpOperand2->LineIsZero())
			m_pexpOperand2->PropagateLineAndFile(m_lnf);
	}